

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdCelsiusLightEnable::emulate_mthd(MthdCelsiusLightEnable *this)

{
  uint32_t uVar1;
  
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c & 0x100) ==
      0) {
    if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
      uVar1 = CONCAT22(*(undefined2 *)
                        ((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                                celsius_xf_misc_a + 2),
                       (short)(this->super_SingleMthdTest).super_MthdTest.val);
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a = uVar1;
      if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 0x10000000) ==
          0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] = uVar1
        ;
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
      }
    }
    return;
  }
  MthdTest::warn((MthdTest *)this,4);
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.celsius_xf_misc_a, 0, 16, val);
				if (!extr(exp.debug_d, 28, 1)) {
					exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
					exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
				}
			}
		}
	}